

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.cc
# Opt level: O0

void absl::SetAndroidNativeTag(char *tag)

{
  undefined8 __s;
  __pointer_type __p;
  __pointer_type pcVar1;
  int local_e0 [2];
  char *local_d8;
  char *absl_raw_log_internal_filename_1;
  string local_c8 [39];
  allocator<char> local_a1;
  undefined1 local_a0 [8];
  string death_message_1;
  string *tag_str;
  char *local_68;
  char *absl_raw_log_internal_filename;
  string local_58 [39];
  allocator<char> local_31;
  undefined1 local_30 [8];
  string death_message;
  char *tag_local;
  
  death_message.field_2._8_8_ = tag;
  if (tag == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_30,"Check tag failed: ",&local_31);
    std::allocator<char>::~allocator(&local_31);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_58,"tag must be non-null.",
               (allocator<char> *)((long)&absl_raw_log_internal_filename + 7));
    std::__cxx11::string::operator+=((string *)local_30,local_58);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)((long)&absl_raw_log_internal_filename + 7))
    ;
    local_68 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/log/globals.cc"
    ;
    tag_str._4_4_ = 3;
    tag_str._0_4_ = 0x8a;
    base_internal::
    AtomicHook<void(*)(absl::LogSeverity,char_const*,int,std::__cxx11::string_const&)>::operator()
              ((AtomicHook<void(*)(absl::LogSeverity,char_const*,int,std::__cxx11::string_const&)> *
               )raw_log_internal::internal_log_function_abi_cxx11_,
               (LogSeverity *)((long)&tag_str + 4),&local_68,(int *)&tag_str,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/log/globals.cc"
                  ,0x8a,"void absl::SetAndroidNativeTag(const char *)");
  }
  __p = (__pointer_type)operator_new(0x20);
  __s = death_message.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__p,(char *)__s,
             (allocator<char> *)(death_message_1.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(death_message_1.field_2._M_local_buf + 0xf));
  pcVar1 = (__pointer_type)std::__cxx11::string::c_str();
  pcVar1 = std::atomic<const_char_*>::exchange
                     ((atomic<const_char_*> *)&(anonymous_namespace)::android_log_tag,pcVar1,
                      memory_order_acq_rel);
  if (pcVar1 == "native") {
    std::
    atomic<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
    ::store(&SetAndroidNativeTag(char_const*)::user_log_tag_abi_cxx11_,__p,memory_order_relaxed);
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,
             "Check android_log_tag.exchange(tag_str->c_str(), std::memory_order_acq_rel) == kDefaultAndroidTag failed: "
             ,&local_a1);
  std::allocator<char>::~allocator(&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c8,"SetAndroidNativeTag() must only be called once per process!",
             (allocator<char> *)((long)&absl_raw_log_internal_filename_1 + 7));
  std::__cxx11::string::operator+=((string *)local_a0,local_c8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&absl_raw_log_internal_filename_1 + 7))
  ;
  local_d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/log/globals.cc"
  ;
  local_e0[1] = 3;
  local_e0[0] = 0x90;
  base_internal::AtomicHook<void(*)(absl::LogSeverity,char_const*,int,std::__cxx11::string_const&)>
  ::operator()((AtomicHook<void(*)(absl::LogSeverity,char_const*,int,std::__cxx11::string_const&)> *
               )raw_log_internal::internal_log_function_abi_cxx11_,(LogSeverity *)(local_e0 + 1),
               &local_d8,local_e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/log/globals.cc"
                ,0x90,"void absl::SetAndroidNativeTag(const char *)");
}

Assistant:

void SetAndroidNativeTag(const char* tag) {
  ABSL_CONST_INIT static std::atomic<const std::string*> user_log_tag(nullptr);
  ABSL_INTERNAL_CHECK(tag, "tag must be non-null.");

  const std::string* tag_str = new std::string(tag);
  ABSL_INTERNAL_CHECK(
      android_log_tag.exchange(tag_str->c_str(), std::memory_order_acq_rel) ==
          kDefaultAndroidTag,
      "SetAndroidNativeTag() must only be called once per process!");
  user_log_tag.store(tag_str, std::memory_order_relaxed);
}